

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_tar.c
# Opt level: O2

void verify3(archive *a,archive_entry *ae)

{
  mode_t mVar1;
  la_int64_t lVar2;
  char *pcVar3;
  time_t v1;
  
  mVar1 = archive_entry_filetype(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_xar.c"
                      ,L'á',(ulong)mVar1,"archive_entry_filetype(ae)",0x2000,"AE_IFCHR",(void *)0x0
                     );
  mVar1 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_xar.c"
                      ,L'â',(ulong)(mVar1 & 0x1ff),"archive_entry_mode(ae) & 0777",0x1a4,"0644",
                      (void *)0x0);
  lVar2 = archive_entry_uid(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_xar.c"
                      ,L'ã',lVar2,"archive_entry_uid(ae)",0x3e9,"UID",(void *)0x0);
  lVar2 = archive_entry_gid(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_xar.c"
                      ,L'ä',lVar2,"archive_entry_gid(ae)",0x3e9,"GID",(void *)0x0);
  pcVar3 = archive_entry_uname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_xar.c"
             ,L'å',pcVar3,"archive_entry_uname(ae)","cue","UNAME",(void *)0x0,L'\0');
  pcVar3 = archive_entry_gname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_xar.c"
             ,L'æ',pcVar3,"archive_entry_gname(ae)","cue","GNAME",(void *)0x0,L'\0');
  pcVar3 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_xar.c"
             ,L'ç',pcVar3,"archive_entry_pathname(ae)","devchar","\"devchar\"",(void *)0x0,L'\0');
  pcVar3 = archive_entry_symlink(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_xar.c"
                   ,L'è',(uint)(pcVar3 == (char *)0x0),"archive_entry_symlink(ae) == NULL",
                   (void *)0x0);
  pcVar3 = archive_entry_hardlink(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_xar.c"
                   ,L'é',(uint)(pcVar3 == (char *)0x0),"archive_entry_hardlink(ae) == NULL",
                   (void *)0x0);
  v1 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_xar.c"
                      ,L'ê',v1,"archive_entry_mtime(ae)",0x15181,"86401",(void *)0x0);
  return;
}

Assistant:

static void verify3(struct archive_entry *ae)
{
	assertEqualInt(archive_entry_filetype(ae), AE_IFCHR);
	assertEqualInt(archive_entry_mode(ae) & 0777, 0755);
	assertEqualInt(archive_entry_uid(ae), 1000);
	assertEqualInt(archive_entry_gid(ae), 1000);
	assertEqualString(archive_entry_uname(ae), "tim");
	assertEqualString(archive_entry_gname(ae), "tim");
	assertEqualString(archive_entry_pathname(ae), "devchar");
	assert(archive_entry_symlink(ae) == NULL);
	assert(archive_entry_hardlink(ae) == NULL);
	assertEqualInt(archive_entry_mtime(ae), 1184389185);
}